

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void arena_large_malloc_stats_update(tsdn_t *tsdn,arena_t *arena,size_t usize)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  malloc_mutex_t *mutex;
  arena_stats_large_t *paVar3;
  int iVar4;
  uint uVar5;
  pthread_mutex_t *__mutex;
  mutex_prof_data_t *data;
  
  if (usize < 0x1001) {
    uVar5 = (uint)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    uVar5 = sz_size2index_compute(usize);
    if (0x3fff < usize) {
      LOCK();
      paVar3 = (arena->stats).lstats + (uVar5 - 0x24);
      (paVar3->nmalloc).val.repr = (paVar3->nmalloc).val.repr + 1;
      UNLOCK();
      return;
    }
  }
  mutex = (malloc_mutex_t *)
          ((long)&arena->nthreads[0].repr + (ulong)duckdb_je_arena_bin_offsets[uVar5]);
  __mutex = (pthread_mutex_t *)
            ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr +
            (ulong)duckdb_je_arena_bin_offsets[uVar5]);
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(mutex);
    (mutex->field_0).field_0.locked.repr = true;
  }
  puVar1 = &(mutex->field_0).field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
    (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(mutex->field_0).witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  mutex[1].field_0.witness.name = mutex[1].field_0.witness.name + 1;
  (mutex->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

static void
arena_large_malloc_stats_update(tsdn_t *tsdn, arena_t *arena, size_t usize) {
	cassert(config_stats);

	szind_t index = sz_size2index(usize);
	/* This only occurs when we have a sampled small allocation */
	if (usize < SC_LARGE_MINCLASS) {
		assert(index < SC_NBINS);
		assert(usize >= PAGE && usize % PAGE == 0);
		bin_t *bin = arena_get_bin(arena, index, /* binshard */ 0);
		malloc_mutex_lock(tsdn, &bin->lock);
		bin->stats.nmalloc++;
		malloc_mutex_unlock(tsdn, &bin->lock);
	} else {
		assert(index >= SC_NBINS);
		szind_t hindex = index - SC_NBINS;
		LOCKEDINT_MTX_LOCK(tsdn, arena->stats.mtx);
		locked_inc_u64(tsdn, LOCKEDINT_MTX(arena->stats.mtx),
			&arena->stats.lstats[hindex].nmalloc, 1);
		LOCKEDINT_MTX_UNLOCK(tsdn, arena->stats.mtx);
	}
}